

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::preprocessingPlusAfterLineFeed(CScanner *this,char c)

{
  int iVar1;
  undefined8 uVar2;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  if ((1 < iVar1 - 9U) && (iVar1 != 0x20)) {
    if (iVar1 == 0x2a) {
      uVar2 = 0x200000003;
    }
    else {
      if (iVar1 != 0x7b) {
        if (iVar1 == 0x3b) {
          warning(this,W_Semicolon,';');
          return;
        }
        this->preprocessingState = PS_Initial;
        preprocessing(this,c);
        return;
      }
      uVar2 = 0x200000004;
    }
    this->preprocessingState = (int)uVar2;
    this->savedPreprocessingState = (int)((ulong)uVar2 >> 0x20);
  }
  return;
}

Assistant:

void CScanner::preprocessingPlusAfterLineFeed( char c )
{
	switch( c ) {
		case Semicolon:
			warning( W_Semicolon, c );
			break;
		case LineFeed:
			break;
		case SingleLineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_SingleLineComment;
			break;
		case MultilineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_MultilineComment;
			break;
		default:
			if( !IsSpace( c ) ) {
				preprocessingState = PS_Initial;
				preprocessing( c );
			}
			break;
	}
}